

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O0

size_t bignIdVerify_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  sVar3 = ecpIsOnA_deep(in_RDI,in_RSI);
  sVar4 = zzMul_deep(in_RDI >> 1,in_RDI >> 1);
  sVar5 = zzMod_deep(in_RDI + 1,in_RDI);
  sVar6 = ecAddMulA_deep(in_RDI,in_RDX,in_RCX,3,in_RDI,(in_RDI >> 1) + 1,in_RDI);
  sVar2 = utilMax(5,sVar2,sVar3,sVar4,sVar5,sVar6);
  return (in_RDI * 7 + 2) * 8 + sVar1 + sVar2;
}

Assistant:

static size_t bignIdVerify_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(7 * n + 2) + beltHash_keep() +
		utilMax(5,
			beltHash_keep(),
			ecpIsOnA_deep(n, f_deep),
			zzMul_deep(n / 2, n / 2),
			zzMod_deep(n + 1, n),
			ecAddMulA_deep(n, ec_d, ec_deep, 3, n, n / 2 + 1, n));
}